

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCheckedActualCall_unExpectedParameterName_TestShell::
~TEST_MockCheckedActualCall_unExpectedParameterName_TestShell
          (TEST_MockCheckedActualCall_unExpectedParameterName_TestShell *this)

{
  TEST_MockCheckedActualCall_unExpectedParameterName_TestShell *this_local;
  
  ~TEST_MockCheckedActualCall_unExpectedParameterName_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockCheckedActualCall, unExpectedParameterName)
{
    MockCheckedExpectedCall call1;
    call1.withName("func");
    list->addExpectedCall(&call1);

    MockCheckedActualCall actualCall(1, reporter, *list);
    actualCall.withName("func").withParameter("integer", 1);

    MockNamedValue parameter("integer");
    parameter.setValue(1);

    MockUnexpectedInputParameterFailure expectedFailure(mockFailureTest(), "func", parameter, *list);
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}